

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stablesum.h
# Opt level: O2

void __thiscall soplex::StableSum<double>::operator+=(StableSum<double> *this,double input)

{
  double dVar1;
  double dVar2;
  
  dVar1 = this->sum;
  dVar2 = dVar1 + input;
  this->c = (input - (dVar2 - dVar1)) + (dVar1 - (dVar2 - (dVar2 - dVar1))) + this->c;
  this->sum = dVar2;
  return;
}

Assistant:

void operator+=(double input)
   {
#ifdef SOPLEX_CHECK_STABLESUM
      checksum += input;
#endif
      double t = sum + input;
      double z = t - sum;
      double y = (sum - (t - z)) + (input - z);
      c += y;

      sum = t;
   }